

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::TriangleMvMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong uVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [32];
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  byte bVar34;
  byte bVar35;
  int iVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  byte bVar38;
  undefined4 uVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [32];
  byte bVar42;
  NodeRef root;
  long lVar43;
  ulong *puVar44;
  bool bVar45;
  byte bVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  uint uVar85;
  uint uVar86;
  uint uVar87;
  uint uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar101 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d19;
  Geometry *local_5d18;
  BVH *local_5d10;
  Intersectors *local_5d08;
  RayQueryContext *local_5d00;
  size_t local_5cf8;
  RayK<8> *local_5cf0;
  ulong local_5ce8;
  undefined1 local_5ce0 [32];
  ulong local_5cb8;
  RTCFilterFunctionNArguments local_5cb0;
  undefined1 local_5c80 [32];
  int local_5c60;
  int iStack_5c5c;
  int iStack_5c58;
  int iStack_5c54;
  int iStack_5c50;
  int iStack_5c4c;
  int iStack_5c48;
  int iStack_5c44;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined1 local_5c00 [32];
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [8];
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5b60;
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  undefined4 uStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  undefined4 uStack_5a04;
  undefined1 local_5a00 [32];
  int local_59e0;
  int iStack_59dc;
  int iStack_59d8;
  int iStack_59d4;
  int iStack_59d0;
  int iStack_59cc;
  int iStack_59c8;
  int iStack_59c4;
  uint local_59c0;
  uint uStack_59bc;
  uint uStack_59b8;
  uint uStack_59b4;
  uint uStack_59b0;
  uint uStack_59ac;
  uint uStack_59a8;
  uint uStack_59a4;
  uint local_59a0;
  uint uStack_599c;
  uint uStack_5998;
  uint uStack_5994;
  uint uStack_5990;
  uint uStack_598c;
  uint uStack_5988;
  uint uStack_5984;
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  undefined4 uStack_58a4;
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  uint local_5860;
  uint uStack_585c;
  uint uStack_5858;
  uint uStack_5854;
  uint uStack_5850;
  uint uStack_584c;
  uint uStack_5848;
  uint uStack_5844;
  uint local_5840;
  uint uStack_583c;
  uint uStack_5838;
  uint uStack_5834;
  uint uStack_5830;
  uint uStack_582c;
  uint uStack_5828;
  uint uStack_5824;
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d10 = (BVH *)This->ptr;
  if ((local_5d10->root).ptr != 8) {
    auVar50 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar49 = ZEXT816(0) << 0x40;
    uVar47 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar49),5);
    uVar40 = vpcmpeqd_avx512vl(auVar50,(undefined1  [32])valid_i->field_0);
    uVar47 = uVar47 & uVar40;
    bVar46 = (byte)uVar47;
    if (bVar46 != 0) {
      local_5b60._0_4_ = *(undefined4 *)ray;
      local_5b60._4_4_ = *(undefined4 *)(ray + 4);
      local_5b60._8_4_ = *(undefined4 *)(ray + 8);
      local_5b60._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5b60._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5b60._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5b60._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5b60._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5b60._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5b60._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5b60._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5b60._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5b60._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5b60._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5b60._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5b60._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5b60._64_4_ = *(undefined4 *)(ray + 0x40);
      local_5b60._68_4_ = *(undefined4 *)(ray + 0x44);
      local_5b60._72_4_ = *(undefined4 *)(ray + 0x48);
      local_5b60._76_4_ = *(undefined4 *)(ray + 0x4c);
      local_5b60._80_4_ = *(undefined4 *)(ray + 0x50);
      local_5b60._84_4_ = *(undefined4 *)(ray + 0x54);
      local_5b60._88_4_ = *(undefined4 *)(ray + 0x58);
      local_5b60._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_5b00 = *(undefined1 (*) [32])(ray + 0x80);
      local_5ae0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_5ac0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar96 = ZEXT3264(auVar50);
      vandps_avx512vl(local_5b00,auVar50);
      auVar51._8_4_ = 0x219392ef;
      auVar51._0_8_ = 0x219392ef219392ef;
      auVar51._12_4_ = 0x219392ef;
      auVar51._16_4_ = 0x219392ef;
      auVar51._20_4_ = 0x219392ef;
      auVar51._24_4_ = 0x219392ef;
      auVar51._28_4_ = 0x219392ef;
      uVar40 = vcmpps_avx512vl(auVar50,auVar51,1);
      bVar45 = (bool)((byte)uVar40 & 1);
      auVar53._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._0_4_;
      bVar45 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar53._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._4_4_;
      bVar45 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar53._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._8_4_;
      bVar45 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar53._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._12_4_;
      bVar45 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar53._16_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._16_4_;
      bVar45 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar53._20_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._20_4_;
      bVar45 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar53._24_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._24_4_;
      bVar45 = SUB81(uVar40 >> 7,0);
      auVar53._28_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5b00._28_4_;
      vandps_avx512vl(local_5ae0,auVar50);
      uVar40 = vcmpps_avx512vl(auVar53,auVar51,1);
      bVar45 = (bool)((byte)uVar40 & 1);
      auVar54._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._0_4_;
      bVar45 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar54._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._4_4_;
      bVar45 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar54._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._8_4_;
      bVar45 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar54._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._12_4_;
      bVar45 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar54._16_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._16_4_;
      bVar45 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar54._20_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._20_4_;
      bVar45 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar54._24_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._24_4_;
      bVar45 = SUB81(uVar40 >> 7,0);
      auVar54._28_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ae0._28_4_;
      vandps_avx512vl(local_5ac0,auVar50);
      uVar40 = vcmpps_avx512vl(auVar54,auVar51,1);
      bVar45 = (bool)((byte)uVar40 & 1);
      auVar50._0_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._0_4_;
      bVar45 = (bool)((byte)(uVar40 >> 1) & 1);
      auVar50._4_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._4_4_;
      bVar45 = (bool)((byte)(uVar40 >> 2) & 1);
      auVar50._8_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._8_4_;
      bVar45 = (bool)((byte)(uVar40 >> 3) & 1);
      auVar50._12_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._12_4_;
      bVar45 = (bool)((byte)(uVar40 >> 4) & 1);
      auVar50._16_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._16_4_;
      bVar45 = (bool)((byte)(uVar40 >> 5) & 1);
      auVar50._20_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._20_4_;
      bVar45 = (bool)((byte)(uVar40 >> 6) & 1);
      auVar50._24_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._24_4_;
      bVar45 = SUB81(uVar40 >> 7,0);
      auVar50._28_4_ = (uint)bVar45 * 0x219392ef | (uint)!bVar45 * local_5ac0._28_4_;
      auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar97 = ZEXT3264(auVar51);
      auVar52 = vrcp14ps_avx512vl(auVar53);
      auVar53 = vfnmadd213ps_avx512vl(auVar53,auVar52,auVar51);
      auVar15 = vfmadd132ps_fma(auVar53,auVar52,auVar52);
      auVar53 = vrcp14ps_avx512vl(auVar54);
      auVar54 = vfnmadd213ps_avx512vl(auVar54,auVar53,auVar51);
      auVar16 = vfmadd132ps_fma(auVar54,auVar53,auVar53);
      auVar53 = vrcp14ps_avx512vl(auVar50);
      auVar50 = vfnmadd213ps_avx512vl(auVar50,auVar53,auVar51);
      local_5aa0 = ZEXT1632(auVar15);
      local_5a80 = ZEXT1632(auVar16);
      auVar17 = vfmadd132ps_fma(auVar50,auVar53,auVar53);
      local_5a60 = ZEXT1632(auVar17);
      local_5a40 = (float)local_5b60._0_4_ * auVar15._0_4_;
      fStack_5a3c = (float)local_5b60._4_4_ * auVar15._4_4_;
      fStack_5a38 = (float)local_5b60._8_4_ * auVar15._8_4_;
      fStack_5a34 = (float)local_5b60._12_4_ * auVar15._12_4_;
      fStack_5a30 = (float)local_5b60._16_4_ * 0.0;
      fStack_5a2c = (float)local_5b60._20_4_ * 0.0;
      fStack_5a28 = (float)local_5b60._24_4_ * 0.0;
      local_5a20 = (float)local_5b60._32_4_ * auVar16._0_4_;
      fStack_5a1c = (float)local_5b60._36_4_ * auVar16._4_4_;
      fStack_5a18 = (float)local_5b60._40_4_ * auVar16._8_4_;
      fStack_5a14 = (float)local_5b60._44_4_ * auVar16._12_4_;
      fStack_5a10 = (float)local_5b60._48_4_ * 0.0;
      fStack_5a0c = (float)local_5b60._52_4_ * 0.0;
      fStack_5a08 = (float)local_5b60._56_4_ * 0.0;
      local_5a00._4_4_ = (float)local_5b60._68_4_ * auVar17._4_4_;
      local_5a00._0_4_ = (float)local_5b60._64_4_ * auVar17._0_4_;
      local_5a00._8_4_ = (float)local_5b60._72_4_ * auVar17._8_4_;
      local_5a00._12_4_ = (float)local_5b60._76_4_ * auVar17._12_4_;
      local_5a00._16_4_ = (float)local_5b60._80_4_ * 0.0;
      local_5a00._20_4_ = (float)local_5b60._84_4_ * 0.0;
      local_5a00._24_4_ = (float)local_5b60._88_4_ * 0.0;
      local_5a00._28_4_ = local_5b60._92_4_;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar15),ZEXT1632(auVar49),1);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      local_59e0 = (uint)((byte)uVar40 & 1) * auVar50._0_4_;
      iStack_59dc = (uint)((byte)(uVar40 >> 1) & 1) * auVar50._4_4_;
      iStack_59d8 = (uint)((byte)(uVar40 >> 2) & 1) * auVar50._8_4_;
      iStack_59d4 = (uint)((byte)(uVar40 >> 3) & 1) * auVar50._12_4_;
      iStack_59d0 = (uint)((byte)(uVar40 >> 4) & 1) * auVar50._16_4_;
      iStack_59cc = (uint)((byte)(uVar40 >> 5) & 1) * auVar50._20_4_;
      iStack_59c8 = (uint)((byte)(uVar40 >> 6) & 1) * auVar50._24_4_;
      iStack_59c4 = (uint)(byte)(uVar40 >> 7) * auVar50._28_4_;
      auVar53 = ZEXT1632(auVar49);
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar16),auVar53,5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar45 = (bool)((byte)uVar40 & 1);
      local_59c0 = (uint)bVar45 * auVar50._0_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_59bc = (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_59b8 = (uint)bVar45 * auVar50._8_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_59b4 = (uint)bVar45 * auVar50._12_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_59b0 = (uint)bVar45 * auVar50._16_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_59ac = (uint)bVar45 * auVar50._20_4_ | (uint)!bVar45 * 0x60;
      bVar45 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_59a8 = (uint)bVar45 * auVar50._24_4_ | (uint)!bVar45 * 0x60;
      bVar45 = SUB81(uVar40 >> 7,0);
      uStack_59a4 = (uint)bVar45 * auVar50._28_4_ | (uint)!bVar45 * 0x60;
      uVar40 = vcmpps_avx512vl(ZEXT1632(auVar17),auVar53,5);
      auVar50 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar45 = (bool)((byte)uVar40 & 1);
      local_59a0 = (uint)bVar45 * auVar50._0_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 1) & 1);
      uStack_599c = (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 2) & 1);
      uStack_5998 = (uint)bVar45 * auVar50._8_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 3) & 1);
      uStack_5994 = (uint)bVar45 * auVar50._12_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 4) & 1);
      uStack_5990 = (uint)bVar45 * auVar50._16_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 5) & 1);
      uStack_598c = (uint)bVar45 * auVar50._20_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = (bool)((byte)(uVar40 >> 6) & 1);
      uStack_5988 = (uint)bVar45 * auVar50._24_4_ | (uint)!bVar45 * 0xa0;
      bVar45 = SUB81(uVar40 >> 7,0);
      uStack_5984 = (uint)bVar45 * auVar50._28_4_ | (uint)!bVar45 * 0xa0;
      local_4680 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar99 = ZEXT3264(local_4680);
      auVar50 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar53);
      local_5980._0_4_ =
           (uint)(bVar46 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar46 & 1) * local_4680._0_4_;
      bVar45 = (bool)((byte)(uVar47 >> 1) & 1);
      local_5980._4_4_ = (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * local_4680._4_4_;
      bVar45 = (bool)((byte)(uVar47 >> 2) & 1);
      local_5980._8_4_ = (uint)bVar45 * auVar50._8_4_ | (uint)!bVar45 * local_4680._8_4_;
      bVar45 = (bool)((byte)(uVar47 >> 3) & 1);
      local_5980._12_4_ = (uint)bVar45 * auVar50._12_4_ | (uint)!bVar45 * local_4680._12_4_;
      bVar45 = (bool)((byte)(uVar47 >> 4) & 1);
      local_5980._16_4_ = (uint)bVar45 * auVar50._16_4_ | (uint)!bVar45 * local_4680._16_4_;
      bVar45 = (bool)((byte)(uVar47 >> 5) & 1);
      local_5980._20_4_ = (uint)bVar45 * auVar50._20_4_ | (uint)!bVar45 * local_4680._20_4_;
      bVar45 = (bool)((byte)(uVar47 >> 6) & 1);
      local_5980._24_4_ = (uint)bVar45 * auVar50._24_4_ | (uint)!bVar45 * local_4680._24_4_;
      bVar45 = SUB81(uVar47 >> 7,0);
      local_5980._28_4_ = (uint)bVar45 * auVar50._28_4_ | (uint)!bVar45 * local_4680._28_4_;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar98 = ZEXT3264(auVar50);
      auVar53 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar53);
      bVar45 = (bool)((byte)(uVar47 >> 1) & 1);
      bVar3 = (bool)((byte)(uVar47 >> 2) & 1);
      bVar4 = (bool)((byte)(uVar47 >> 3) & 1);
      bVar5 = (bool)((byte)(uVar47 >> 4) & 1);
      bVar6 = (bool)((byte)(uVar47 >> 5) & 1);
      bVar7 = (bool)((byte)(uVar47 >> 6) & 1);
      bVar8 = SUB81(uVar47 >> 7,0);
      local_5960._4_4_ = (uint)bVar45 * auVar53._4_4_ | (uint)!bVar45 * auVar50._4_4_;
      local_5960._0_4_ =
           (uint)(bVar46 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar46 & 1) * auVar50._0_4_;
      local_5960._8_4_ = (uint)bVar3 * auVar53._8_4_ | (uint)!bVar3 * auVar50._8_4_;
      local_5960._12_4_ = (uint)bVar4 * auVar53._12_4_ | (uint)!bVar4 * auVar50._12_4_;
      local_5960._16_4_ = (uint)bVar5 * auVar53._16_4_ | (uint)!bVar5 * auVar50._16_4_;
      local_5960._20_4_ = (uint)bVar6 * auVar53._20_4_ | (uint)!bVar6 * auVar50._20_4_;
      local_5960._24_4_ = (uint)bVar7 * auVar53._24_4_ | (uint)!bVar7 * auVar50._24_4_;
      local_5960._28_4_ = (uint)bVar8 * auVar53._28_4_ | (uint)!bVar8 * auVar50._28_4_;
      bVar42 = ~bVar46;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar47 = 7;
      }
      else {
        uVar47 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      local_5cf0 = ray + 0x100;
      puVar44 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar41 = (undefined1 (*) [32])local_4640;
      local_4660 = local_5980;
      local_5808 = (local_5d10->root).ptr;
      auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar100 = ZEXT3264(auVar50);
      auVar49 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar101 = ZEXT1664(auVar49);
      local_5d08 = This;
      local_5d00 = context;
      local_5ce8 = uVar47;
      uStack_5a24 = local_5b60._28_4_;
      uStack_5a04 = local_5b60._60_4_;
LAB_00875882:
      pauVar41 = pauVar41 + -1;
      root.ptr = puVar44[-1];
      puVar44 = puVar44 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_0087613c;
      auVar50 = *pauVar41;
      local_5d18 = (Geometry *)vcmpps_avx512vl(auVar50,local_5960,1);
      if ((char)local_5d18 == '\0') {
LAB_0087614d:
        iVar36 = 2;
      }
      else {
        uVar39 = SUB84(local_5d18,0);
        iVar36 = 0;
        if ((uint)POPCOUNT(uVar39) <= uVar47) {
          do {
            local_5ce0 = auVar50;
            local_5cf8 = 0;
            for (uVar47 = (ulong)local_5d18; (uVar47 & 1) == 0;
                uVar47 = uVar47 >> 1 | 0x8000000000000000) {
              local_5cf8 = local_5cf8 + 1;
            }
            bVar45 = occluded1(local_5d08,local_5d10,root,local_5cf8,&local_5d19,ray,
                               (TravRayK<8,_false> *)&local_5b60.field_0,local_5d00);
            bVar34 = (byte)(1 << ((uint)local_5cf8 & 0x1f));
            if (!bVar45) {
              bVar34 = 0;
            }
            bVar42 = bVar42 | bVar34;
            local_5d18 = (Geometry *)((long)local_5d18 - 1U & (ulong)local_5d18);
            auVar50 = local_5ce0;
          } while (local_5d18 != (Geometry *)0x0);
          if (bVar42 == 0xff) {
            iVar36 = 3;
          }
          else {
            auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_5960._0_4_ =
                 (uint)(bVar42 & 1) * auVar53._0_4_ | (uint)!(bool)(bVar42 & 1) * local_5960._0_4_;
            bVar45 = (bool)(bVar42 >> 1 & 1);
            local_5960._4_4_ = (uint)bVar45 * auVar53._4_4_ | (uint)!bVar45 * local_5960._4_4_;
            bVar45 = (bool)(bVar42 >> 2 & 1);
            local_5960._8_4_ = (uint)bVar45 * auVar53._8_4_ | (uint)!bVar45 * local_5960._8_4_;
            bVar45 = (bool)(bVar42 >> 3 & 1);
            local_5960._12_4_ = (uint)bVar45 * auVar53._12_4_ | (uint)!bVar45 * local_5960._12_4_;
            bVar45 = (bool)(bVar42 >> 4 & 1);
            local_5960._16_4_ = (uint)bVar45 * auVar53._16_4_ | (uint)!bVar45 * local_5960._16_4_;
            bVar45 = (bool)(bVar42 >> 5 & 1);
            local_5960._20_4_ = (uint)bVar45 * auVar53._20_4_ | (uint)!bVar45 * local_5960._20_4_;
            bVar45 = (bool)(bVar42 >> 6 & 1);
            local_5960._24_4_ = (uint)bVar45 * auVar53._24_4_ | (uint)!bVar45 * local_5960._24_4_;
            local_5960._28_4_ =
                 (uint)(bVar42 >> 7) * auVar53._28_4_ |
                 (uint)!(bool)(bVar42 >> 7) * local_5960._28_4_;
            iVar36 = 2;
          }
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar96 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar97 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar98 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar99 = ZEXT3264(auVar53);
          auVar53 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar100 = ZEXT3264(auVar53);
          auVar49 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
          auVar101 = ZEXT1664(auVar49);
        }
        auVar95 = ZEXT3264(auVar50);
        uVar47 = local_5ce8;
        if ((uint)local_5ce8 < (uint)POPCOUNT(uVar39)) {
          do {
            auVar50 = auVar95._0_32_;
            uVar85 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0087613c;
              uVar13 = vcmpps_avx512vl(auVar50,local_5960,9);
              if ((char)uVar13 == '\0') goto LAB_0087614d;
              local_5cb8 = (ulong)(uVar85 & 0xf) - 8;
              bVar34 = bVar42;
              if (local_5cb8 == 0) goto LAB_0087610e;
              bVar34 = ~bVar42;
              lVar43 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar47 = 0;
              goto LAB_00875b1a;
            }
            uVar37 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar95 = ZEXT3264(auVar99._0_32_);
            uVar40 = 0;
            do {
              uVar1 = *(ulong *)(uVar37 + uVar40 * 8);
              if (uVar1 != 8) {
                uVar39 = *(undefined4 *)(uVar37 + 0x100 + uVar40 * 4);
                auVar74._4_4_ = uVar39;
                auVar74._0_4_ = uVar39;
                auVar74._8_4_ = uVar39;
                auVar74._12_4_ = uVar39;
                auVar74._16_4_ = uVar39;
                auVar74._20_4_ = uVar39;
                auVar74._24_4_ = uVar39;
                auVar74._28_4_ = uVar39;
                auVar53 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar39 = *(undefined4 *)(uVar37 + 0x40 + uVar40 * 4);
                auVar20._4_4_ = uVar39;
                auVar20._0_4_ = uVar39;
                auVar20._8_4_ = uVar39;
                auVar20._12_4_ = uVar39;
                auVar20._16_4_ = uVar39;
                auVar20._20_4_ = uVar39;
                auVar20._24_4_ = uVar39;
                auVar20._28_4_ = uVar39;
                auVar54 = vfmadd213ps_avx512vl(auVar74,auVar53,auVar20);
                uVar39 = *(undefined4 *)(uVar37 + 0x140 + uVar40 * 4);
                auVar76._4_4_ = uVar39;
                auVar76._0_4_ = uVar39;
                auVar76._8_4_ = uVar39;
                auVar76._12_4_ = uVar39;
                auVar76._16_4_ = uVar39;
                auVar76._20_4_ = uVar39;
                auVar76._24_4_ = uVar39;
                auVar76._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar37 + 0x80 + uVar40 * 4);
                auVar21._4_4_ = uVar39;
                auVar21._0_4_ = uVar39;
                auVar21._8_4_ = uVar39;
                auVar21._12_4_ = uVar39;
                auVar21._16_4_ = uVar39;
                auVar21._20_4_ = uVar39;
                auVar21._24_4_ = uVar39;
                auVar21._28_4_ = uVar39;
                auVar51 = vfmadd213ps_avx512vl(auVar76,auVar53,auVar21);
                uVar39 = *(undefined4 *)(uVar37 + 0x180 + uVar40 * 4);
                auVar77._4_4_ = uVar39;
                auVar77._0_4_ = uVar39;
                auVar77._8_4_ = uVar39;
                auVar77._12_4_ = uVar39;
                auVar77._16_4_ = uVar39;
                auVar77._20_4_ = uVar39;
                auVar77._24_4_ = uVar39;
                auVar77._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar37 + 0xc0 + uVar40 * 4);
                auVar22._4_4_ = uVar39;
                auVar22._0_4_ = uVar39;
                auVar22._8_4_ = uVar39;
                auVar22._12_4_ = uVar39;
                auVar22._16_4_ = uVar39;
                auVar22._20_4_ = uVar39;
                auVar22._24_4_ = uVar39;
                auVar22._28_4_ = uVar39;
                auVar52 = vfmadd213ps_avx512vl(auVar77,auVar53,auVar22);
                uVar39 = *(undefined4 *)(uVar37 + 0x120 + uVar40 * 4);
                auVar79._4_4_ = uVar39;
                auVar79._0_4_ = uVar39;
                auVar79._8_4_ = uVar39;
                auVar79._12_4_ = uVar39;
                auVar79._16_4_ = uVar39;
                auVar79._20_4_ = uVar39;
                auVar79._24_4_ = uVar39;
                auVar79._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar37 + 0x60 + uVar40 * 4);
                auVar23._4_4_ = uVar39;
                auVar23._0_4_ = uVar39;
                auVar23._8_4_ = uVar39;
                auVar23._12_4_ = uVar39;
                auVar23._16_4_ = uVar39;
                auVar23._20_4_ = uVar39;
                auVar23._24_4_ = uVar39;
                auVar23._28_4_ = uVar39;
                auVar55 = vfmadd213ps_avx512vl(auVar79,auVar53,auVar23);
                uVar39 = *(undefined4 *)(uVar37 + 0x160 + uVar40 * 4);
                auVar81._4_4_ = uVar39;
                auVar81._0_4_ = uVar39;
                auVar81._8_4_ = uVar39;
                auVar81._12_4_ = uVar39;
                auVar81._16_4_ = uVar39;
                auVar81._20_4_ = uVar39;
                auVar81._24_4_ = uVar39;
                auVar81._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar37 + 0xa0 + uVar40 * 4);
                auVar24._4_4_ = uVar39;
                auVar24._0_4_ = uVar39;
                auVar24._8_4_ = uVar39;
                auVar24._12_4_ = uVar39;
                auVar24._16_4_ = uVar39;
                auVar24._20_4_ = uVar39;
                auVar24._24_4_ = uVar39;
                auVar24._28_4_ = uVar39;
                auVar56 = vfmadd213ps_avx512vl(auVar81,auVar53,auVar24);
                uVar39 = *(undefined4 *)(uVar37 + 0x1a0 + uVar40 * 4);
                auVar83._4_4_ = uVar39;
                auVar83._0_4_ = uVar39;
                auVar83._8_4_ = uVar39;
                auVar83._12_4_ = uVar39;
                auVar83._16_4_ = uVar39;
                auVar83._20_4_ = uVar39;
                auVar83._24_4_ = uVar39;
                auVar83._28_4_ = uVar39;
                uVar39 = *(undefined4 *)(uVar37 + 0xe0 + uVar40 * 4);
                auVar25._4_4_ = uVar39;
                auVar25._0_4_ = uVar39;
                auVar25._8_4_ = uVar39;
                auVar25._12_4_ = uVar39;
                auVar25._16_4_ = uVar39;
                auVar25._20_4_ = uVar39;
                auVar25._24_4_ = uVar39;
                auVar25._28_4_ = uVar39;
                auVar57 = vfmadd213ps_avx512vl(auVar83,auVar53,auVar25);
                auVar32._4_4_ = fStack_5a3c;
                auVar32._0_4_ = local_5a40;
                auVar32._8_4_ = fStack_5a38;
                auVar32._12_4_ = fStack_5a34;
                auVar32._16_4_ = fStack_5a30;
                auVar32._20_4_ = fStack_5a2c;
                auVar32._24_4_ = fStack_5a28;
                auVar32._28_4_ = uStack_5a24;
                auVar49 = vfmsub213ps_fma(auVar54,local_5aa0,auVar32);
                auVar33._4_4_ = fStack_5a1c;
                auVar33._0_4_ = local_5a20;
                auVar33._8_4_ = fStack_5a18;
                auVar33._12_4_ = fStack_5a14;
                auVar33._16_4_ = fStack_5a10;
                auVar33._20_4_ = fStack_5a0c;
                auVar33._24_4_ = fStack_5a08;
                auVar33._28_4_ = uStack_5a04;
                auVar15 = vfmsub213ps_fma(auVar51,local_5a80,auVar33);
                auVar16 = vfmsub213ps_fma(auVar52,local_5a60,local_5a00);
                auVar17 = vfmsub213ps_fma(auVar55,local_5aa0,auVar32);
                auVar18 = vfmsub213ps_fma(auVar56,local_5a80,auVar33);
                auVar19 = vfmsub213ps_fma(auVar57,local_5a60,local_5a00);
                auVar54 = vpminsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar17));
                auVar51 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar18));
                auVar54 = vpmaxsd_avx2(auVar54,auVar51);
                auVar51 = vpminsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar19));
                auVar54 = vpmaxsd_avx2(auVar54,auVar51);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar17));
                auVar52 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar18));
                auVar52 = vpminsd_avx2(auVar51,auVar52);
                auVar51 = vpmaxsd_avx2(ZEXT1632(auVar16),ZEXT1632(auVar19));
                auVar52 = vpminsd_avx2(auVar52,auVar51);
                auVar51 = vpmaxsd_avx2(auVar54,local_5980);
                auVar52 = vpminsd_avx2(auVar52,local_5960);
                uVar48 = vcmpps_avx512vl(auVar51,auVar52,2);
                if ((uVar85 & 7) == 6) {
                  uVar39 = *(undefined4 *)(uVar37 + 0x1c0 + uVar40 * 4);
                  auVar26._4_4_ = uVar39;
                  auVar26._0_4_ = uVar39;
                  auVar26._8_4_ = uVar39;
                  auVar26._12_4_ = uVar39;
                  auVar26._16_4_ = uVar39;
                  auVar26._20_4_ = uVar39;
                  auVar26._24_4_ = uVar39;
                  auVar26._28_4_ = uVar39;
                  uVar11 = vcmpps_avx512vl(auVar53,auVar26,0xd);
                  uVar39 = *(undefined4 *)(uVar37 + 0x1e0 + uVar40 * 4);
                  auVar27._4_4_ = uVar39;
                  auVar27._0_4_ = uVar39;
                  auVar27._8_4_ = uVar39;
                  auVar27._12_4_ = uVar39;
                  auVar27._16_4_ = uVar39;
                  auVar27._20_4_ = uVar39;
                  auVar27._24_4_ = uVar39;
                  auVar27._28_4_ = uVar39;
                  uVar12 = vcmpps_avx512vl(auVar53,auVar27,1);
                  uVar48 = uVar48 & uVar11 & uVar12;
                }
                uVar11 = vcmpps_avx512vl(local_5960,auVar50,6);
                uVar48 = uVar48 & uVar11;
                if ((byte)uVar48 != 0) {
                  auVar54 = vblendmps_avx512vl(auVar99._0_32_,auVar54);
                  bVar45 = (bool)((byte)uVar48 & 1);
                  bVar3 = (bool)((byte)(uVar48 >> 1) & 1);
                  bVar4 = (bool)((byte)(uVar48 >> 2) & 1);
                  bVar5 = (bool)((byte)(uVar48 >> 3) & 1);
                  bVar6 = (bool)((byte)(uVar48 >> 4) & 1);
                  bVar7 = (bool)((byte)(uVar48 >> 5) & 1);
                  bVar8 = (bool)((byte)(uVar48 >> 6) & 1);
                  bVar9 = SUB81(uVar48 >> 7,0);
                  if (root.ptr != 8) {
                    *puVar44 = root.ptr;
                    puVar44 = puVar44 + 1;
                    *pauVar41 = auVar95._0_32_;
                    pauVar41 = pauVar41 + 1;
                  }
                  auVar95 = ZEXT3264(CONCAT428((uint)bVar9 * auVar54._28_4_ |
                                               (uint)!bVar9 * auVar53._28_4_,
                                               CONCAT424((uint)bVar8 * auVar54._24_4_ |
                                                         (uint)!bVar8 * auVar53._24_4_,
                                                         CONCAT420((uint)bVar7 * auVar54._20_4_ |
                                                                   (uint)!bVar7 * auVar53._20_4_,
                                                                   CONCAT416((uint)bVar6 *
                                                                             auVar54._16_4_ |
                                                                             (uint)!bVar6 *
                                                                             auVar53._16_4_,
                                                                             CONCAT412((uint)bVar5 *
                                                                                       auVar54.
                                                  _12_4_ | (uint)!bVar5 * auVar53._12_4_,
                                                  CONCAT48((uint)bVar4 * auVar54._8_4_ |
                                                           (uint)!bVar4 * auVar53._8_4_,
                                                           CONCAT44((uint)bVar3 * auVar54._4_4_ |
                                                                    (uint)!bVar3 * auVar53._4_4_,
                                                                    (uint)bVar45 * auVar54._0_4_ |
                                                                    (uint)!bVar45 * auVar53._0_4_)))
                                                  )))));
                  root.ptr = uVar1;
                }
              }
            } while ((uVar1 != 8) && (bVar45 = uVar40 < 7, uVar40 = uVar40 + 1, bVar45));
            iVar36 = 0;
            if (root.ptr == 8) {
LAB_00875acc:
              bVar45 = false;
              iVar36 = 4;
            }
            else {
              uVar13 = vcmpps_avx512vl(auVar95._0_32_,local_5960,9);
              bVar45 = true;
              if ((uint)POPCOUNT((int)uVar13) <= (uint)local_5ce8) {
                *puVar44 = root.ptr;
                puVar44 = puVar44 + 1;
                *pauVar41 = auVar95._0_32_;
                pauVar41 = pauVar41 + 1;
                goto LAB_00875acc;
              }
            }
          } while (bVar45);
        }
      }
      goto LAB_0087613f;
    }
  }
  return;
  while( true ) {
    uVar47 = uVar47 + 1;
    lVar43 = lVar43 + 0x140;
    if (local_5cb8 <= uVar47) break;
LAB_00875b1a:
    local_5ce0._0_8_ = uVar47;
    uVar40 = 0;
    bVar35 = bVar34;
    while (uVar37 = (ulong)*(uint *)(lVar43 + -0x10 + uVar40 * 4), uVar37 != 0xffffffff) {
      auVar50 = *(undefined1 (*) [32])(ray + 0x80);
      auVar53 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar54 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar51 = *(undefined1 (*) [32])(ray + 0xe0);
      uVar39 = *(undefined4 *)(lVar43 + -0xa0 + uVar40 * 4);
      auVar67._4_4_ = uVar39;
      auVar67._0_4_ = uVar39;
      auVar67._8_4_ = uVar39;
      auVar67._12_4_ = uVar39;
      auVar67._16_4_ = uVar39;
      auVar67._20_4_ = uVar39;
      auVar67._24_4_ = uVar39;
      auVar67._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x90 + uVar40 * 4);
      auVar69._4_4_ = uVar39;
      auVar69._0_4_ = uVar39;
      auVar69._8_4_ = uVar39;
      auVar69._12_4_ = uVar39;
      auVar69._16_4_ = uVar39;
      auVar69._20_4_ = uVar39;
      auVar69._24_4_ = uVar39;
      auVar69._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x80 + uVar40 * 4);
      auVar80._4_4_ = uVar39;
      auVar80._0_4_ = uVar39;
      auVar80._8_4_ = uVar39;
      auVar80._12_4_ = uVar39;
      auVar80._16_4_ = uVar39;
      auVar80._20_4_ = uVar39;
      auVar80._24_4_ = uVar39;
      auVar80._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x130 + uVar40 * 4);
      auVar52._4_4_ = uVar39;
      auVar52._0_4_ = uVar39;
      auVar52._8_4_ = uVar39;
      auVar52._12_4_ = uVar39;
      auVar52._16_4_ = uVar39;
      auVar52._20_4_ = uVar39;
      auVar52._24_4_ = uVar39;
      auVar52._28_4_ = uVar39;
      auVar58 = vfmadd213ps_avx512vl(auVar67,auVar51,auVar52);
      uVar39 = *(undefined4 *)(lVar43 + -0x120 + uVar40 * 4);
      auVar55._4_4_ = uVar39;
      auVar55._0_4_ = uVar39;
      auVar55._8_4_ = uVar39;
      auVar55._12_4_ = uVar39;
      auVar55._16_4_ = uVar39;
      auVar55._20_4_ = uVar39;
      auVar55._24_4_ = uVar39;
      auVar55._28_4_ = uVar39;
      auVar59 = vfmadd213ps_avx512vl(auVar69,auVar51,auVar55);
      uVar39 = *(undefined4 *)(lVar43 + -0x110 + uVar40 * 4);
      auVar56._4_4_ = uVar39;
      auVar56._0_4_ = uVar39;
      auVar56._8_4_ = uVar39;
      auVar56._12_4_ = uVar39;
      auVar56._16_4_ = uVar39;
      auVar56._20_4_ = uVar39;
      auVar56._24_4_ = uVar39;
      auVar56._28_4_ = uVar39;
      auVar60 = vfmadd213ps_avx512vl(auVar80,auVar51,auVar56);
      uVar39 = *(undefined4 *)(lVar43 + -0x70 + uVar40 * 4);
      auVar64._4_4_ = uVar39;
      auVar64._0_4_ = uVar39;
      auVar64._8_4_ = uVar39;
      auVar64._12_4_ = uVar39;
      auVar64._16_4_ = uVar39;
      auVar64._20_4_ = uVar39;
      auVar64._24_4_ = uVar39;
      auVar64._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x60 + uVar40 * 4);
      auVar65._4_4_ = uVar39;
      auVar65._0_4_ = uVar39;
      auVar65._8_4_ = uVar39;
      auVar65._12_4_ = uVar39;
      auVar65._16_4_ = uVar39;
      auVar65._20_4_ = uVar39;
      auVar65._24_4_ = uVar39;
      auVar65._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x50 + uVar40 * 4);
      auVar84._4_4_ = uVar39;
      auVar84._0_4_ = uVar39;
      auVar84._8_4_ = uVar39;
      auVar84._12_4_ = uVar39;
      auVar84._16_4_ = uVar39;
      auVar84._20_4_ = uVar39;
      auVar84._24_4_ = uVar39;
      auVar84._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x100 + uVar40 * 4);
      auVar57._4_4_ = uVar39;
      auVar57._0_4_ = uVar39;
      auVar57._8_4_ = uVar39;
      auVar57._12_4_ = uVar39;
      auVar57._16_4_ = uVar39;
      auVar57._20_4_ = uVar39;
      auVar57._24_4_ = uVar39;
      auVar57._28_4_ = uVar39;
      auVar57 = vfmadd213ps_avx512vl(auVar64,auVar51,auVar57);
      uVar39 = *(undefined4 *)(lVar43 + -0xf0 + uVar40 * 4);
      auVar66._4_4_ = uVar39;
      auVar66._0_4_ = uVar39;
      auVar66._8_4_ = uVar39;
      auVar66._12_4_ = uVar39;
      auVar66._16_4_ = uVar39;
      auVar66._20_4_ = uVar39;
      auVar66._24_4_ = uVar39;
      auVar66._28_4_ = uVar39;
      auVar52 = vfmadd213ps_avx512vl(auVar65,auVar51,auVar66);
      uVar39 = *(undefined4 *)(lVar43 + -0xe0 + uVar40 * 4);
      auVar10._4_4_ = uVar39;
      auVar10._0_4_ = uVar39;
      auVar10._8_4_ = uVar39;
      auVar10._12_4_ = uVar39;
      auVar10._16_4_ = uVar39;
      auVar10._20_4_ = uVar39;
      auVar10._24_4_ = uVar39;
      auVar10._28_4_ = uVar39;
      auVar55 = vfmadd213ps_avx512vl(auVar84,auVar51,auVar10);
      uVar39 = *(undefined4 *)(lVar43 + -0x40 + uVar40 * 4);
      auVar92._4_4_ = uVar39;
      auVar92._0_4_ = uVar39;
      auVar92._8_4_ = uVar39;
      auVar92._12_4_ = uVar39;
      auVar92._16_4_ = uVar39;
      auVar92._20_4_ = uVar39;
      auVar92._24_4_ = uVar39;
      auVar92._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x30 + uVar40 * 4);
      auVar93._4_4_ = uVar39;
      auVar93._0_4_ = uVar39;
      auVar93._8_4_ = uVar39;
      auVar93._12_4_ = uVar39;
      auVar93._16_4_ = uVar39;
      auVar93._20_4_ = uVar39;
      auVar93._24_4_ = uVar39;
      auVar93._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0x20 + uVar40 * 4);
      auVar94._4_4_ = uVar39;
      auVar94._0_4_ = uVar39;
      auVar94._8_4_ = uVar39;
      auVar94._12_4_ = uVar39;
      auVar94._16_4_ = uVar39;
      auVar94._20_4_ = uVar39;
      auVar94._24_4_ = uVar39;
      auVar94._28_4_ = uVar39;
      uVar39 = *(undefined4 *)(lVar43 + -0xd0 + uVar40 * 4);
      auVar61._4_4_ = uVar39;
      auVar61._0_4_ = uVar39;
      auVar61._8_4_ = uVar39;
      auVar61._12_4_ = uVar39;
      auVar61._16_4_ = uVar39;
      auVar61._20_4_ = uVar39;
      auVar61._24_4_ = uVar39;
      auVar61._28_4_ = uVar39;
      auVar61 = vfmadd213ps_avx512vl(auVar92,auVar51,auVar61);
      uVar39 = *(undefined4 *)(lVar43 + -0xc0 + uVar40 * 4);
      auVar62._4_4_ = uVar39;
      auVar62._0_4_ = uVar39;
      auVar62._8_4_ = uVar39;
      auVar62._12_4_ = uVar39;
      auVar62._16_4_ = uVar39;
      auVar62._20_4_ = uVar39;
      auVar62._24_4_ = uVar39;
      auVar62._28_4_ = uVar39;
      auVar62 = vfmadd213ps_avx512vl(auVar93,auVar51,auVar62);
      uVar39 = *(undefined4 *)(lVar43 + -0xb0 + uVar40 * 4);
      auVar63._4_4_ = uVar39;
      auVar63._0_4_ = uVar39;
      auVar63._8_4_ = uVar39;
      auVar63._12_4_ = uVar39;
      auVar63._16_4_ = uVar39;
      auVar63._20_4_ = uVar39;
      auVar63._24_4_ = uVar39;
      auVar63._28_4_ = uVar39;
      auVar63 = vfmadd213ps_avx512vl(auVar94,auVar51,auVar63);
      auVar51 = vsubps_avx(auVar58,auVar57);
      auVar52 = vsubps_avx(auVar59,auVar52);
      auVar55 = vsubps_avx(auVar60,auVar55);
      auVar56 = vsubps_avx(auVar61,auVar58);
      auVar64 = vsubps_avx512vl(auVar62,auVar59);
      auVar65 = vsubps_avx512vl(auVar63,auVar60);
      auVar66 = vmulps_avx512vl(auVar52,auVar65);
      auVar67 = vfmsub231ps_avx512vl(auVar66,auVar64,auVar55);
      auVar68._4_4_ = auVar55._4_4_ * auVar56._4_4_;
      auVar68._0_4_ = auVar55._0_4_ * auVar56._0_4_;
      auVar68._8_4_ = auVar55._8_4_ * auVar56._8_4_;
      auVar68._12_4_ = auVar55._12_4_ * auVar56._12_4_;
      auVar68._16_4_ = auVar55._16_4_ * auVar56._16_4_;
      auVar68._20_4_ = auVar55._20_4_ * auVar56._20_4_;
      auVar68._24_4_ = auVar55._24_4_ * auVar56._24_4_;
      auVar68._28_4_ = auVar57._28_4_;
      auVar68 = vfmsub231ps_avx512vl(auVar68,auVar65,auVar51);
      auVar69 = vmulps_avx512vl(auVar51,auVar64);
      auVar16 = vfmsub231ps_fma(auVar69,auVar56,auVar52);
      auVar57 = vsubps_avx(auVar58,*(undefined1 (*) [32])ray);
      auVar66 = vsubps_avx(auVar59,*(undefined1 (*) [32])(ray + 0x20));
      auVar10 = vsubps_avx(auVar60,*(undefined1 (*) [32])(ray + 0x40));
      auVar58._4_4_ = auVar53._4_4_ * auVar10._4_4_;
      auVar58._0_4_ = auVar53._0_4_ * auVar10._0_4_;
      auVar58._8_4_ = auVar53._8_4_ * auVar10._8_4_;
      auVar58._12_4_ = auVar53._12_4_ * auVar10._12_4_;
      auVar58._16_4_ = auVar53._16_4_ * auVar10._16_4_;
      auVar58._20_4_ = auVar53._20_4_ * auVar10._20_4_;
      auVar58._24_4_ = auVar53._24_4_ * auVar10._24_4_;
      auVar58._28_4_ = auVar61._28_4_;
      auVar17 = vfmsub231ps_fma(auVar58,auVar66,auVar54);
      auVar59._4_4_ = auVar54._4_4_ * auVar57._4_4_;
      auVar59._0_4_ = auVar54._0_4_ * auVar57._0_4_;
      auVar59._8_4_ = auVar54._8_4_ * auVar57._8_4_;
      auVar59._12_4_ = auVar54._12_4_ * auVar57._12_4_;
      auVar59._16_4_ = auVar54._16_4_ * auVar57._16_4_;
      auVar59._20_4_ = auVar54._20_4_ * auVar57._20_4_;
      auVar59._24_4_ = auVar54._24_4_ * auVar57._24_4_;
      auVar59._28_4_ = auVar62._28_4_;
      auVar18 = vfmsub231ps_fma(auVar59,auVar10,auVar50);
      auVar60._4_4_ = auVar50._4_4_ * auVar66._4_4_;
      auVar60._0_4_ = auVar50._0_4_ * auVar66._0_4_;
      auVar60._8_4_ = auVar50._8_4_ * auVar66._8_4_;
      auVar60._12_4_ = auVar50._12_4_ * auVar66._12_4_;
      auVar60._16_4_ = auVar50._16_4_ * auVar66._16_4_;
      auVar60._20_4_ = auVar50._20_4_ * auVar66._20_4_;
      auVar60._24_4_ = auVar50._24_4_ * auVar66._24_4_;
      auVar60._28_4_ = auVar63._28_4_;
      auVar19 = vfmsub231ps_fma(auVar60,auVar57,auVar53);
      auVar28._4_4_ = auVar16._4_4_ * auVar54._4_4_;
      auVar28._0_4_ = auVar16._0_4_ * auVar54._0_4_;
      auVar28._8_4_ = auVar16._8_4_ * auVar54._8_4_;
      auVar28._12_4_ = auVar16._12_4_ * auVar54._12_4_;
      auVar28._16_4_ = auVar54._16_4_ * 0.0;
      auVar28._20_4_ = auVar54._20_4_ * 0.0;
      auVar28._24_4_ = auVar54._24_4_ * 0.0;
      auVar28._28_4_ = auVar54._28_4_;
      auVar49 = vfmadd231ps_fma(auVar28,auVar68,auVar53);
      auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar67,auVar50);
      vandps_avx512vl(ZEXT1632(auVar49),auVar100._0_32_);
      auVar50 = vmulps_avx512vl(auVar65,ZEXT1632(auVar19));
      auVar50 = vfmadd231ps_avx512vl(auVar50,ZEXT1632(auVar18),auVar64);
      auVar15 = vfmadd231ps_fma(auVar50,ZEXT1632(auVar17),auVar56);
      uVar85 = auVar69._0_4_;
      auVar73._0_4_ = uVar85 ^ auVar15._0_4_;
      uVar86 = auVar69._4_4_;
      auVar73._4_4_ = uVar86 ^ auVar15._4_4_;
      uVar87 = auVar69._8_4_;
      auVar73._8_4_ = uVar87 ^ auVar15._8_4_;
      uVar88 = auVar69._12_4_;
      auVar73._12_4_ = uVar88 ^ auVar15._12_4_;
      uVar39 = auVar69._16_4_;
      auVar73._16_4_ = uVar39;
      uVar89 = auVar69._20_4_;
      auVar73._20_4_ = uVar89;
      uVar90 = auVar69._24_4_;
      auVar73._24_4_ = uVar90;
      uVar91 = auVar69._28_4_;
      auVar73._28_4_ = uVar91;
      uVar13 = vcmpps_avx512vl(auVar73,auVar101._0_32_,5);
      local_5cf8 = CONCAT71(local_5cf8._1_7_,bVar35);
      bVar38 = (byte)uVar13 & bVar35;
      if (bVar38 == 0) {
LAB_00875c97:
        bVar38 = 0;
      }
      else {
        auVar29._4_4_ = auVar55._4_4_ * auVar19._4_4_;
        auVar29._0_4_ = auVar55._0_4_ * auVar19._0_4_;
        auVar29._8_4_ = auVar55._8_4_ * auVar19._8_4_;
        auVar29._12_4_ = auVar55._12_4_ * auVar19._12_4_;
        auVar29._16_4_ = auVar55._16_4_ * 0.0;
        auVar29._20_4_ = auVar55._20_4_ * 0.0;
        auVar29._24_4_ = auVar55._24_4_ * 0.0;
        auVar29._28_4_ = auVar55._28_4_;
        auVar15 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar52,auVar29);
        auVar15 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar51,ZEXT1632(auVar15));
        auVar82._0_4_ = uVar85 ^ auVar15._0_4_;
        auVar82._4_4_ = uVar86 ^ auVar15._4_4_;
        auVar82._8_4_ = uVar87 ^ auVar15._8_4_;
        auVar82._12_4_ = uVar88 ^ auVar15._12_4_;
        auVar82._16_4_ = uVar39;
        auVar82._20_4_ = uVar89;
        auVar82._24_4_ = uVar90;
        auVar82._28_4_ = uVar91;
        uVar13 = vcmpps_avx512vl(auVar82,auVar101._0_32_,5);
        bVar38 = bVar38 & (byte)uVar13;
        if (bVar38 == 0) goto LAB_00875c97;
        auVar53 = auVar96._0_32_;
        vandps_avx512vl(ZEXT1632(auVar49),auVar53);
        auVar50 = vsubps_avx(auVar53,auVar73);
        uVar13 = vcmpps_avx512vl(auVar50,auVar82,5);
        bVar38 = bVar38 & (byte)uVar13;
        if (bVar38 == 0) {
LAB_00876017:
          bVar38 = 0;
        }
        else {
          auVar30._4_4_ = auVar10._4_4_ * auVar16._4_4_;
          auVar30._0_4_ = auVar10._0_4_ * auVar16._0_4_;
          auVar30._8_4_ = auVar10._8_4_ * auVar16._8_4_;
          auVar30._12_4_ = auVar10._12_4_ * auVar16._12_4_;
          auVar30._16_4_ = auVar10._16_4_ * 0.0;
          auVar30._20_4_ = auVar10._20_4_ * 0.0;
          auVar30._24_4_ = auVar10._24_4_ * 0.0;
          auVar30._28_4_ = auVar10._28_4_;
          auVar15 = vfmadd213ps_fma(auVar66,auVar68,auVar30);
          auVar15 = vfmadd213ps_fma(auVar57,auVar67,ZEXT1632(auVar15));
          auVar78._0_4_ = auVar96._0_4_ * *(float *)(ray + 0x60);
          auVar78._4_4_ = auVar96._4_4_ * *(float *)(ray + 100);
          auVar78._8_4_ = auVar96._8_4_ * *(float *)(ray + 0x68);
          auVar78._12_4_ = auVar96._12_4_ * *(float *)(ray + 0x6c);
          auVar78._16_4_ = auVar96._16_4_ * *(float *)(ray + 0x70);
          auVar78._20_4_ = auVar96._20_4_ * *(float *)(ray + 0x74);
          auVar78._24_4_ = auVar96._24_4_ * *(float *)(ray + 0x78);
          auVar78._28_4_ = 0;
          auVar75._0_4_ = uVar85 ^ auVar15._0_4_;
          auVar75._4_4_ = uVar86 ^ auVar15._4_4_;
          auVar75._8_4_ = uVar87 ^ auVar15._8_4_;
          auVar75._12_4_ = uVar88 ^ auVar15._12_4_;
          auVar75._16_4_ = uVar39;
          auVar75._20_4_ = uVar89;
          auVar75._24_4_ = uVar90;
          auVar75._28_4_ = uVar91;
          auVar31._4_4_ = auVar96._4_4_ * *(float *)(ray + 0x104);
          auVar31._0_4_ = auVar96._0_4_ * *(float *)(ray + 0x100);
          auVar31._8_4_ = auVar96._8_4_ * *(float *)(ray + 0x108);
          auVar31._12_4_ = auVar96._12_4_ * *(float *)(ray + 0x10c);
          auVar31._16_4_ = auVar96._16_4_ * *(float *)(ray + 0x110);
          auVar31._20_4_ = auVar96._20_4_ * *(float *)(ray + 0x114);
          auVar31._24_4_ = auVar96._24_4_ * *(float *)(ray + 0x118);
          auVar31._28_4_ = auVar10._28_4_;
          uVar13 = vcmpps_avx512vl(auVar75,auVar31,2);
          uVar14 = vcmpps_avx512vl(auVar78,auVar75,1);
          bVar38 = bVar38 & (byte)uVar13 & (byte)uVar14;
          if (bVar38 == 0) goto LAB_00876017;
          uVar13 = vcmpps_avx512vl(ZEXT1632(auVar49),ZEXT832(0) << 0x20,4);
          bVar38 = bVar38 & (byte)uVar13;
          if (bVar38 != 0) {
            local_5c40 = ZEXT1632(auVar16);
            local_5c20 = auVar68;
            local_5c00 = auVar67;
            local_5be0 = auVar53;
            local_5bc0 = auVar75;
            _local_5ba0 = auVar82;
            _local_5b80 = auVar73;
          }
        }
        auVar96 = ZEXT3264(auVar53);
        auVar49 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
        auVar101 = ZEXT1664(auVar49);
      }
      auVar49 = auVar101._0_16_;
      local_5d18 = (local_5d00->scene->geometries).items[uVar37].ptr;
      uVar85 = local_5d18->mask;
      auVar72._4_4_ = uVar85;
      auVar72._0_4_ = uVar85;
      auVar72._8_4_ = uVar85;
      auVar72._12_4_ = uVar85;
      auVar72._16_4_ = uVar85;
      auVar72._20_4_ = uVar85;
      auVar72._24_4_ = uVar85;
      auVar72._28_4_ = uVar85;
      uVar13 = vptestmd_avx512vl(auVar72,*(undefined1 (*) [32])(ray + 0x120));
      bVar38 = (byte)uVar13 & bVar38;
      uVar37 = (ulong)bVar38;
      if (bVar38 != 0) {
        if ((local_5d00->args->filter == (RTCFilterFunctionN)0x0) &&
           (local_5d18->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          uVar47 = local_5ce0._0_8_;
        }
        else {
          auVar50 = vrcp14ps_avx512vl(local_5be0);
          auVar53 = vfnmadd213ps_avx512vl(auVar50,local_5be0,auVar97._0_32_);
          auVar15 = vfmadd132ps_fma(auVar53,auVar50,auVar50);
          local_58e0._4_4_ = auVar15._4_4_ * (float)local_5b80._4_4_;
          local_58e0._0_4_ = auVar15._0_4_ * (float)local_5b80._0_4_;
          local_58e0._8_4_ = auVar15._8_4_ * fStack_5b78;
          local_58e0._12_4_ = auVar15._12_4_ * fStack_5b74;
          local_58e0._16_4_ = fStack_5b70 * 0.0;
          local_58e0._20_4_ = fStack_5b6c * 0.0;
          local_58e0._24_4_ = fStack_5b68 * 0.0;
          local_58e0._28_4_ = auVar50._28_4_;
          local_58c0 = auVar15._0_4_ * (float)local_5ba0._0_4_;
          fStack_58bc = auVar15._4_4_ * (float)local_5ba0._4_4_;
          fStack_58b8 = auVar15._8_4_ * fStack_5b98;
          fStack_58b4 = auVar15._12_4_ * fStack_5b94;
          fStack_58b0 = fStack_5b90 * 0.0;
          fStack_58ac = fStack_5b8c * 0.0;
          uStack_58a4 = local_5be0._28_4_;
          fStack_58a8 = fStack_5b88 * 0.0;
          local_5880 = vpbroadcastd_avx512vl();
          local_58a0 = vpbroadcastd_avx512vl();
          local_5940 = local_5c00._0_8_;
          uStack_5938 = local_5c00._8_8_;
          uStack_5930 = local_5c00._16_8_;
          uStack_5928 = local_5c00._24_8_;
          local_5920 = local_5c20._0_8_;
          uStack_5918 = local_5c20._8_8_;
          uStack_5910 = local_5c20._16_8_;
          uStack_5908 = local_5c20._24_8_;
          local_5900 = local_5c40;
          vpcmpeqd_avx2(local_58e0,local_58e0);
          uStack_585c = local_5d00->user->instID[0];
          local_5860 = uStack_585c;
          uStack_5858 = uStack_585c;
          uStack_5854 = uStack_585c;
          uStack_5850 = uStack_585c;
          uStack_584c = uStack_585c;
          uStack_5848 = uStack_585c;
          uStack_5844 = uStack_585c;
          uStack_583c = local_5d00->user->instPrimID[0];
          local_5840 = uStack_583c;
          uStack_5838 = uStack_583c;
          uStack_5834 = uStack_583c;
          uStack_5830 = uStack_583c;
          uStack_582c = uStack_583c;
          uStack_5828 = uStack_583c;
          uStack_5824 = uStack_583c;
          local_5c60 = *(int *)(ray + 0x100);
          iStack_5c5c = *(int *)(ray + 0x104);
          iStack_5c58 = *(int *)(ray + 0x108);
          iStack_5c54 = *(int *)(ray + 0x10c);
          iStack_5c50 = *(int *)(ray + 0x110);
          iStack_5c4c = *(int *)(ray + 0x114);
          iStack_5c48 = *(int *)(ray + 0x118);
          iStack_5c44 = *(int *)(ray + 0x11c);
          auVar50 = vmulps_avx512vl(ZEXT1632(auVar15),local_5bc0);
          bVar45 = (bool)(bVar38 >> 1 & 1);
          bVar3 = (bool)(bVar38 >> 2 & 1);
          bVar4 = (bool)(bVar38 >> 3 & 1);
          bVar5 = (bool)(bVar38 >> 4 & 1);
          bVar6 = (bool)(bVar38 >> 5 & 1);
          bVar7 = (bool)(bVar38 >> 6 & 1);
          *(uint *)(ray + 0x100) =
               (uint)(bVar38 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar38 & 1) * local_5c60;
          *(uint *)(ray + 0x104) = (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * iStack_5c5c;
          *(uint *)(ray + 0x108) = (uint)bVar3 * auVar50._8_4_ | (uint)!bVar3 * iStack_5c58;
          *(uint *)(ray + 0x10c) = (uint)bVar4 * auVar50._12_4_ | (uint)!bVar4 * iStack_5c54;
          *(uint *)(ray + 0x110) = (uint)bVar5 * auVar50._16_4_ | (uint)!bVar5 * iStack_5c50;
          *(uint *)(ray + 0x114) = (uint)bVar6 * auVar50._20_4_ | (uint)!bVar6 * iStack_5c4c;
          *(uint *)(ray + 0x118) = (uint)bVar7 * auVar50._24_4_ | (uint)!bVar7 * iStack_5c48;
          *(uint *)(ray + 0x11c) =
               (uint)(bVar38 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar38 >> 7) * iStack_5c44;
          local_5c80 = vpmovm2d_avx512vl((ulong)bVar38);
          local_5cb0.valid = (int *)local_5c80;
          local_5cb0.geometryUserPtr = local_5d18->userPtr;
          local_5cb0.context = local_5d00->user;
          local_5cb0.hit = (RTCHitN *)&local_5940;
          local_5cb0.N = 8;
          local_5cb0.ray = (RTCRayN *)ray;
          if (local_5d18->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*local_5d18->occlusionFilterN)(&local_5cb0);
            auVar49 = vxorps_avx512vl(auVar49,auVar49);
            auVar101 = ZEXT1664(auVar49);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar100 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar99 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar98 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar97 = ZEXT3264(auVar50);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar96 = ZEXT3264(auVar50);
          }
          auVar49 = auVar101._0_16_;
          uVar37 = vptestmd_avx512vl(local_5c80,local_5c80);
          uVar47 = local_5ce0._0_8_;
          if ((char)uVar37 != '\0') {
            p_Var2 = local_5d00->args->filter;
            if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
               (((local_5d00->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((local_5d18->field_8).field_0x2 & 0x40) != 0))))
            {
              (*p_Var2)(&local_5cb0);
              auVar49 = vxorps_avx512vl(auVar49,auVar49);
              auVar101 = ZEXT1664(auVar49);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar100 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar99 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar98 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar97 = ZEXT3264(auVar50);
              auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar96 = ZEXT3264(auVar50);
            }
            uVar37 = vptestmd_avx512vl(local_5c80,local_5c80);
            auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar45 = (bool)((byte)uVar37 & 1);
            auVar70._0_4_ =
                 (uint)bVar45 * auVar50._0_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x100);
            bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
            auVar70._4_4_ =
                 (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x104);
            bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
            auVar70._8_4_ =
                 (uint)bVar45 * auVar50._8_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x108);
            bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
            auVar70._12_4_ =
                 (uint)bVar45 * auVar50._12_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x10c);
            bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
            auVar70._16_4_ =
                 (uint)bVar45 * auVar50._16_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x110);
            bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
            auVar70._20_4_ =
                 (uint)bVar45 * auVar50._20_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x114);
            bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
            auVar70._24_4_ =
                 (uint)bVar45 * auVar50._24_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x118);
            bVar45 = SUB81(uVar37 >> 7,0);
            auVar70._28_4_ =
                 (uint)bVar45 * auVar50._28_4_ | (uint)!bVar45 * *(int *)(local_5cb0.ray + 0x11c);
            *(undefined1 (*) [32])(local_5cb0.ray + 0x100) = auVar70;
            uVar47 = local_5ce0._0_8_;
          }
          bVar45 = (bool)((byte)uVar37 & 1);
          auVar71._0_4_ = (uint)bVar45 * *(int *)local_5cf0 | (uint)!bVar45 * local_5c60;
          bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
          auVar71._4_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 4) | (uint)!bVar45 * iStack_5c5c;
          bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
          auVar71._8_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 8) | (uint)!bVar45 * iStack_5c58;
          bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
          auVar71._12_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 0xc) | (uint)!bVar45 * iStack_5c54;
          bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
          auVar71._16_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 0x10) | (uint)!bVar45 * iStack_5c50;
          bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
          auVar71._20_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 0x14) | (uint)!bVar45 * iStack_5c4c;
          bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
          auVar71._24_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 0x18) | (uint)!bVar45 * iStack_5c48;
          bVar45 = SUB81(uVar37 >> 7,0);
          auVar71._28_4_ = (uint)bVar45 * *(int *)(local_5cf0 + 0x1c) | (uint)!bVar45 * iStack_5c44;
          *(undefined1 (*) [32])local_5cf0 = auVar71;
        }
        bVar35 = (byte)local_5cf8 & ~(byte)uVar37;
      }
      if ((bVar35 == 0) || (bVar45 = 2 < uVar40, uVar40 = uVar40 + 1, bVar45)) break;
    }
    bVar34 = bVar34 & bVar35;
    if (bVar34 == 0) break;
  }
  bVar34 = ~bVar34;
LAB_0087610e:
  bVar42 = bVar42 | bVar34;
  uVar47 = local_5ce8;
  if (bVar42 == 0xff) {
LAB_0087613c:
    iVar36 = 3;
  }
  else {
    auVar50 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    local_5960._0_4_ =
         (uint)(bVar42 & 1) * auVar50._0_4_ | (uint)!(bool)(bVar42 & 1) * local_5960._0_4_;
    bVar45 = (bool)(bVar42 >> 1 & 1);
    local_5960._4_4_ = (uint)bVar45 * auVar50._4_4_ | (uint)!bVar45 * local_5960._4_4_;
    bVar45 = (bool)(bVar42 >> 2 & 1);
    local_5960._8_4_ = (uint)bVar45 * auVar50._8_4_ | (uint)!bVar45 * local_5960._8_4_;
    bVar45 = (bool)(bVar42 >> 3 & 1);
    local_5960._12_4_ = (uint)bVar45 * auVar50._12_4_ | (uint)!bVar45 * local_5960._12_4_;
    bVar45 = (bool)(bVar42 >> 4 & 1);
    local_5960._16_4_ = (uint)bVar45 * auVar50._16_4_ | (uint)!bVar45 * local_5960._16_4_;
    bVar45 = (bool)(bVar42 >> 5 & 1);
    local_5960._20_4_ = (uint)bVar45 * auVar50._20_4_ | (uint)!bVar45 * local_5960._20_4_;
    bVar45 = (bool)(bVar42 >> 6 & 1);
    local_5960._24_4_ = (uint)bVar45 * auVar50._24_4_ | (uint)!bVar45 * local_5960._24_4_;
    local_5960._28_4_ =
         (uint)(bVar42 >> 7) * auVar50._28_4_ | (uint)!(bool)(bVar42 >> 7) * local_5960._28_4_;
    iVar36 = 0;
  }
LAB_0087613f:
  if (iVar36 == 3) {
    bVar42 = bVar42 & bVar46;
    bVar45 = (bool)(bVar42 >> 1 & 1);
    bVar3 = (bool)(bVar42 >> 2 & 1);
    bVar4 = (bool)(bVar42 >> 3 & 1);
    bVar5 = (bool)(bVar42 >> 4 & 1);
    bVar6 = (bool)(bVar42 >> 5 & 1);
    bVar7 = (bool)(bVar42 >> 6 & 1);
    *(uint *)local_5cf0 =
         (uint)(bVar42 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar42 & 1) * *(int *)local_5cf0;
    *(uint *)(local_5cf0 + 4) =
         (uint)bVar45 * auVar98._4_4_ | (uint)!bVar45 * *(int *)(local_5cf0 + 4);
    *(uint *)(local_5cf0 + 8) =
         (uint)bVar3 * auVar98._8_4_ | (uint)!bVar3 * *(int *)(local_5cf0 + 8);
    *(uint *)(local_5cf0 + 0xc) =
         (uint)bVar4 * auVar98._12_4_ | (uint)!bVar4 * *(int *)(local_5cf0 + 0xc);
    *(uint *)(local_5cf0 + 0x10) =
         (uint)bVar5 * auVar98._16_4_ | (uint)!bVar5 * *(int *)(local_5cf0 + 0x10);
    *(uint *)(local_5cf0 + 0x14) =
         (uint)bVar6 * auVar98._20_4_ | (uint)!bVar6 * *(int *)(local_5cf0 + 0x14);
    *(uint *)(local_5cf0 + 0x18) =
         (uint)bVar7 * auVar98._24_4_ | (uint)!bVar7 * *(int *)(local_5cf0 + 0x18);
    *(uint *)(local_5cf0 + 0x1c) =
         (uint)(bVar42 >> 7) * auVar98._28_4_ |
         (uint)!(bool)(bVar42 >> 7) * *(int *)(local_5cf0 + 0x1c);
    return;
  }
  goto LAB_00875882;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }